

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_tree_connect(connectdata *conn)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t byte_count;
  char *p;
  smb_conn *smbc;
  undefined1 uStack_41c;
  smb_tree_connect msg;
  connectdata *conn_local;
  
  msg.bytes._1016_8_ = conn;
  sVar1 = strlen((conn->host).name);
  sVar2 = strlen((conn->proto).ftpc.pp.linestart_resp);
  if (sVar1 + sVar2 + 10 < 0x401) {
    memset((void *)((long)&smbc + 5),0,0x40b);
    smbc._5_1_ = 4;
    smbc._6_1_ = 0xff;
    _uStack_41c = 0;
    strcpy((char *)&msg.andx.offset,"\\\\");
    strcpy((char *)&msg.flags,*(char **)(msg.bytes._1016_8_ + 0xd0));
    sVar1 = strlen(*(char **)(msg.bytes._1016_8_ + 0xd0));
    strcpy((char *)(sVar1 + (long)&msg.flags),"\\");
    pcVar3 = msg.bytes + (sVar1 - 5);
    strcpy(pcVar3,(conn->proto).ftpc.pp.linestart_resp);
    sVar1 = strlen((conn->proto).ftpc.pp.linestart_resp);
    pcVar3 = pcVar3 + sVar1 + 1;
    strcpy(pcVar3,"?????");
    msg.andx._0_2_ = SUB82(pcVar3 + (6 - (long)&msg.andx.offset),0);
    conn_local._4_4_ =
         smb_send_message((connectdata *)msg.bytes._1016_8_,'u',(void *)((long)&smbc + 5),
                          (size_t)(pcVar3 + (6 - (long)&msg.andx.offset) + 0xb));
  }
  else {
    conn_local._4_4_ = CURLE_FILESIZE_EXCEEDED;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_send_tree_connect(struct connectdata *conn)
{
  struct smb_tree_connect msg;
  struct smb_conn *smbc = &conn->proto.smbc;
  char *p = msg.bytes;

  size_t byte_count = strlen(conn->host.name) + strlen(smbc->share);
  byte_count += strlen(SERVICENAME) + 5; /* 2 nulls and 3 backslashes */
  if(byte_count > sizeof(msg.bytes))
    return CURLE_FILESIZE_EXCEEDED;

  memset(&msg, 0, sizeof(msg));
  msg.word_count = SMB_WC_TREE_CONNECT_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg.pw_len = 0;
  MSGCAT("\\\\");
  MSGCAT(conn->host.name);
  MSGCAT("\\");
  MSGCATNULL(smbc->share);
  MSGCATNULL(SERVICENAME); /* Match any type of service */
  byte_count = p - msg.bytes;
  msg.byte_count = smb_swap16((unsigned short)byte_count);

  return smb_send_message(conn, SMB_COM_TREE_CONNECT_ANDX, &msg,
                          sizeof(msg) - sizeof(msg.bytes) + byte_count);
}